

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# limbo.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
anon_unknown.dwarf_39dbd::commit_to_party_seed
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          limbo_instance_t *instance,vector<unsigned_char,_std::allocator<unsigned_char>_> *seed,
          limbo_salt_t *salt,size_t rep_idx,size_t party_idx)

{
  uint8_t *puVar1;
  hash_context ctx;
  allocator_type local_151;
  limbo_salt_t *local_150;
  limbo_instance_t *local_148;
  hash_context local_140;
  
  local_150 = salt;
  local_148 = instance;
  hash_init(&local_140,(ulong)instance->digest_size);
  Keccak_HashUpdate(&local_140,local_150->_M_elems,0x100);
  hash_update_uint16_le(&local_140,(uint16_t)rep_idx);
  hash_update_uint16_le(&local_140,(uint16_t)party_idx);
  puVar1 = (seed->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  hash_update(&local_140,puVar1,
              (long)(seed->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar1);
  hash_final(&local_140);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,(ulong)local_148->digest_size,&local_151);
  puVar1 = (__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  hash_squeeze(&local_140,puVar1,
               (long)(__return_storage_ptr__->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar1);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> commit_to_party_seed(const limbo_instance_t &instance,
                                          const std::vector<uint8_t> &seed,
                                          const limbo_salt_t &salt,
                                          size_t rep_idx, size_t party_idx) {
  hash_context ctx;
  hash_init(&ctx, instance.digest_size);
  hash_update(&ctx, salt.data(), salt.size());
  hash_update_uint16_le(&ctx, (uint16_t)rep_idx);
  hash_update_uint16_le(&ctx, (uint16_t)party_idx);
  hash_update(&ctx, seed.data(), seed.size());
  hash_final(&ctx);

  std::vector<uint8_t> commitment(instance.digest_size);
  hash_squeeze(&ctx, commitment.data(), commitment.size());
  return commitment;
}